

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  N_Vector p_Var7;
  N_Vector p_Var8;
  SUNMatrix A;
  SUNMatrix p_Var9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  char *__s;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  SUNContext sunctx;
  SUNMatrix local_50;
  N_Vector local_48;
  SUNMatrix local_40;
  N_Vector local_38;
  
  iVar1 = SUNContext_Create(0,&sunctx);
  if (iVar1 == 0) {
    if (argc < 4) {
      __s = "ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing ";
    }
    else {
      lVar5 = atol(argv[1]);
      if (lVar5 < 1) {
        __s = "ERROR: number of rows must be a positive integer ";
      }
      else {
        lVar6 = atol(argv[2]);
        if (0 < lVar6) {
          iVar1 = atoi(argv[3]);
          SetTiming(iVar1);
          p_Var9 = (SUNMatrix)0x0;
          printf("\nDense matrix test: size %ld by %ld\n\n",lVar5,lVar6);
          p_Var7 = (N_Vector)N_VNew_Serial(lVar6,sunctx);
          p_Var8 = (N_Vector)N_VNew_Serial(lVar5,sunctx);
          A = (SUNMatrix)SUNDenseMatrix(lVar5,lVar6,sunctx);
          if (lVar5 == lVar6) {
            p_Var9 = (SUNMatrix)SUNDenseMatrix(lVar5,lVar5,sunctx);
          }
          lVar10 = SUNDenseMatrix_Data();
          lVar12 = 2;
          lVar13 = 1;
          lVar14 = 0;
          lVar15 = 0;
          while (lVar15 != lVar6) {
            lVar15 = lVar15 + 1;
            lVar16 = lVar14;
            for (lVar17 = 0; lVar5 != lVar17; lVar17 = lVar17 + 1) {
              *(double *)(lVar10 + lVar17 * 8) = (double)lVar16;
              lVar16 = lVar16 + lVar13;
            }
            lVar10 = lVar10 + lVar5 * 8;
            lVar14 = lVar14 + lVar12;
            lVar12 = lVar12 + 2;
            lVar13 = lVar13 + 1;
          }
          if (lVar5 == lVar6) {
            puVar11 = (undefined8 *)SUNDenseMatrix_Data(p_Var9);
            for (lVar12 = 0; lVar5 != lVar12; lVar12 = lVar12 + 1) {
              *puVar11 = 0x3ff0000000000000;
              puVar11 = puVar11 + lVar5 + 1;
            }
          }
          lVar13 = N_VGetArrayPointer(p_Var7);
          for (lVar12 = 1; lVar12 - lVar6 != 1; lVar12 = lVar12 + 1) {
            *(double *)(lVar13 + -8 + lVar12 * 8) = 1.0 / (double)lVar12;
          }
          lVar13 = N_VGetArrayPointer(p_Var8);
          lVar12 = lVar6 + -1;
          for (lVar10 = 0; lVar5 != lVar10; lVar10 = lVar10 + 1) {
            *(double *)(lVar13 + lVar10 * 8) = (double)lVar12 * (double)lVar6 * 0.5;
            lVar12 = lVar12 + 2;
          }
          local_50 = p_Var9;
          local_48 = p_Var8;
          local_38 = p_Var7;
          iVar1 = Test_SUNMatGetID(A,SUNMATRIX_DENSE,0);
          iVar2 = Test_SUNMatClone(A,0);
          iVar3 = Test_SUNMatCopy(A,0);
          iVar4 = Test_SUNMatZero(A,0);
          p_Var9 = local_50;
          iVar1 = iVar4 + iVar3 + iVar2 + iVar1;
          if (lVar5 == lVar6) {
            iVar2 = Test_SUNMatScaleAdd(A,local_50,0);
            iVar3 = Test_SUNMatScaleAddI(A,p_Var9,0);
            iVar1 = iVar1 + iVar3 + iVar2;
          }
          p_Var7 = local_38;
          iVar2 = Test_SUNMatMatvec(A,local_38,local_48,0);
          iVar3 = Test_SUNMatSpace(A,0);
          uVar18 = iVar3 + iVar2 + iVar1;
          local_40 = A;
          if (uVar18 == 0) {
            puts("SUCCESS: SUNMatrix module passed all tests \n ");
            p_Var8 = local_48;
          }
          else {
            printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar18);
            puts("\nA =");
            SUNDenseMatrix_Print(A,_stdout);
            if (lVar5 == lVar6) {
              puts("\nI =");
              SUNDenseMatrix_Print(local_50,_stdout);
            }
            puts("\nx =");
            N_VPrint_Serial(p_Var7);
            puts("\ny =");
            p_Var8 = local_48;
            N_VPrint_Serial(local_48);
          }
          N_VDestroy(p_Var7);
          N_VDestroy(p_Var8);
          SUNMatDestroy(local_40);
          if (lVar5 == lVar6) {
            SUNMatDestroy(local_50);
          }
          SUNContext_Free(&sunctx);
          return uVar18;
        }
        __s = "ERROR: number of cols must be a positive integer ";
      }
    }
  }
  else {
    __s = "ERROR: SUNContext_Create failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                 /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector x, y;                 /* test vectors               */
  sunrealtype *xdata, *ydata;    /* pointers to vector data    */
  SUNMatrix A, I;                /* test matrices              */
  sunrealtype *Adata, *Idata;    /* pointers to matrix data    */
  int print_timing, square;
  sunindextype i, j, m, n;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 4)
  {
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print "
           "timing \n");
    return (-1);
  }

  matrows = (sunindextype)atol(argv[1]);
  if (matrows <= 0)
  {
    printf("ERROR: number of rows must be a positive integer \n");
    return (-1);
  }

  matcols = (sunindextype)atol(argv[2]);
  if (matcols <= 0)
  {
    printf("ERROR: number of cols must be a positive integer \n");
    return (-1);
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);

  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n", (long int)matrows,
         (long int)matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols, sunctx);
  y = N_VNew_Serial(matrows, sunctx);
  A = SUNDenseMatrix(matrows, matcols, sunctx);
  I = NULL;
  if (square) { I = SUNDenseMatrix(matrows, matcols, sunctx); }

  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for (j = 0; j < matcols; j++)
  {
    for (i = 0; i < matrows; i++)
    {
      Adata[j * matrows + i] = (j + 1) * (i + j);
    }
  }

  if (square)
  {
    Idata = SUNDenseMatrix_Data(I);
    for (i = 0, j = 0; i < matrows; i++, j++) { Idata[j * matrows + i] = ONE; }
  }

  xdata = N_VGetArrayPointer(x);
  for (i = 0; i < matcols; i++) { xdata[i] = ONE / (i + 1); }

  ydata = N_VGetArrayPointer(y);
  for (i = 0; i < matrows; i++)
  {
    m        = i;
    n        = m + matcols - 1;
    ydata[i] = HALF * (n + 1 - m) * (n + m);
  }

  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square)
  {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A, stdout);
    if (square)
    {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I, stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free vectors and matrices */
  N_VDestroy(x);
  N_VDestroy(y);
  SUNMatDestroy(A);
  if (square) { SUNMatDestroy(I); }
  SUNContext_Free(&sunctx);

  return (fails);
}